

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

baseHolder * __thiscall
cs_impl::any::holder<cs_impl::path_cs_ext::path_info>::duplicate
          (holder<cs_impl::path_cs_ext::path_info> *this)

{
  pointer pcVar1;
  baseHolder *pbVar2;
  
  if ((_DAT_00263dd0 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x30);
  }
  else {
    pbVar2 = *(baseHolder **)
              (&holder<cs_impl::fiber::Channel<cs_impl::any>>::allocator + _DAT_00263dd0 * 8);
    _DAT_00263dd0 = _DAT_00263dd0 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__holder_0025b860;
  pbVar2[1]._vptr_baseHolder = (_func_int **)(pbVar2 + 3);
  pcVar1 = (this->mDat).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pbVar2 + 1),pcVar1,pcVar1 + (this->mDat).name._M_string_length);
  *(int *)&pbVar2[5]._vptr_baseHolder = (this->mDat).type;
  return pbVar2;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}